

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

level_enum __thiscall spdlog::logger::flush_level(logger *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(level_enum *)(in_RDI + 0x44);
}

Assistant:

SPDLOG_INLINE level::level_enum logger::flush_level() const
{
    return static_cast<level::level_enum>(flush_level_.load(std::memory_order_relaxed));
}